

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  long lVar1;
  uchar *puVar2;
  int data_len;
  int iVar3;
  uchar *puVar4;
  void *__ptr;
  long lVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  size_t sVar13;
  long lVar14;
  uchar *puVar15;
  uchar uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_cc;
  int zlen;
  uchar *local_38;
  
  uVar17 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar17;
  }
  data_len = (uVar17 + 1) * y;
  puVar4 = (uchar *)malloc((long)data_len);
  if (puVar4 != (uchar *)0x0) {
    sVar13 = (size_t)(int)uVar17;
    __ptr = malloc(sVar13);
    if (__ptr == (void *)0x0) {
      free(puVar4);
    }
    else {
      lVar6 = (long)stride_bytes;
      uVar11 = 0;
      uVar19 = 0;
      if (0 < n) {
        uVar19 = (ulong)(uint)n;
      }
      lVar14 = (long)n;
      uVar18 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar18 = uVar11;
      }
      uVar8 = 0;
      if (0 < y) {
        uVar8 = (ulong)(uint)y;
      }
      puVar15 = pixels;
      for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        piVar7 = stbi_write_png_to_mem::mapping;
        if (uVar11 == 0) {
          piVar7 = stbi_write_png_to_mem::firstmap;
        }
        lVar10 = uVar11 * lVar6;
        local_cc = 0x7fffffff;
        local_e4 = 0;
        for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
          iVar3 = local_e4;
          if (iVar9 == 0) {
            iVar3 = 0;
          }
          local_dc = local_e4;
          local_e0 = local_cc;
          for (lVar5 = (long)iVar3; lVar5 < 5; lVar5 = lVar5 + 1) {
            iVar3 = piVar7[lVar5];
            for (uVar21 = 0; lVar20 = lVar14, uVar19 != uVar21; uVar21 = uVar21 + 1) {
              switch(iVar3) {
              case 0:
              case 1:
              case 5:
              case 6:
                uVar16 = puVar15[uVar21];
                break;
              case 2:
                uVar16 = puVar15[uVar21] - puVar15[uVar21 - lVar6];
                break;
              case 3:
                uVar16 = puVar15[uVar21];
                bVar12 = puVar15[uVar21 - lVar6] >> 1;
                goto LAB_0011b12e;
              case 4:
                uVar16 = puVar15[uVar21];
                bVar12 = stbiw__paeth(0,(uint)puVar15[uVar21 - lVar6],0);
LAB_0011b12e:
                uVar16 = uVar16 - bVar12;
                break;
              default:
                goto switchD_0011b0d2_default;
              }
              *(uchar *)((long)__ptr + uVar21) = uVar16;
switchD_0011b0d2_default:
            }
            for (; lVar20 < (long)sVar13; lVar20 = lVar20 + 1) {
              switch(iVar3) {
              case 0:
                uVar16 = pixels[lVar20 + lVar10];
                break;
              case 1:
              case 6:
                uVar16 = pixels[lVar20 + lVar10];
                lVar1 = lVar14;
                goto LAB_0011b201;
              case 2:
                uVar16 = pixels[lVar20 + lVar10];
                lVar1 = lVar6;
LAB_0011b201:
                uVar16 = uVar16 - pixels[(lVar20 - lVar1) + lVar10];
                break;
              case 3:
                uVar16 = pixels[lVar20 + lVar10] -
                         (char)((uint)pixels[(lVar20 - lVar6) + lVar10] +
                                (uint)pixels[(lVar20 - lVar14) + lVar10] >> 1);
                break;
              case 4:
                uVar16 = pixels[lVar20 + lVar10];
                bVar12 = stbiw__paeth((uint)pixels[(lVar20 - lVar14) + lVar10],
                                      (uint)pixels[(lVar20 - lVar6) + lVar10],
                                      (uint)pixels[((lVar20 - lVar6) - lVar14) + lVar10]);
                goto LAB_0011b1e8;
              case 5:
                uVar16 = pixels[lVar20 + lVar10];
                bVar12 = pixels[(lVar20 - lVar14) + lVar10] >> 1;
LAB_0011b1e8:
                uVar16 = uVar16 - bVar12;
                break;
              default:
                goto switchD_0011b156_default;
              }
              *(uchar *)((long)__ptr + lVar20) = uVar16;
switchD_0011b156_default:
            }
            if (iVar9 != 0) goto LAB_0011b28a;
            iVar3 = 0;
            for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
              bVar12 = (char)*(byte *)((long)__ptr + uVar21) >> 7;
              iVar3 = iVar3 + (uint)(byte)((*(byte *)((long)__ptr + uVar21) ^ bVar12) - bVar12);
            }
            if (iVar3 < local_e0) {
              local_dc = (int)lVar5;
              local_e0 = iVar3;
            }
          }
          local_e4 = local_dc;
          local_cc = local_e0;
LAB_0011b28a:
        }
        lVar10 = uVar11 * (long)(int)(uVar17 + 1);
        puVar4[lVar10] = (uchar)local_e4;
        memcpy(puVar4 + lVar10 + 1,__ptr,sVar13);
        puVar15 = puVar15 + lVar6;
      }
      free(__ptr);
      puVar15 = stbi_zlib_compress(puVar4,data_len,&zlen,8);
      free(puVar4);
      sVar13 = (size_t)zlen;
      puVar4 = (uchar *)malloc(sVar13 + 0x39);
      if (puVar4 != (uchar *)0x0) {
        *out_len = (int)(sVar13 + 0x39);
        puVar4[0] = 0x89;
        puVar4[1] = 'P';
        puVar4[2] = 'N';
        puVar4[3] = 'G';
        puVar4[4] = '\r';
        puVar4[5] = '\n';
        puVar4[6] = '\x1a';
        puVar4[7] = '\n';
        puVar4[8] = '\0';
        puVar4[9] = '\0';
        puVar4[10] = '\0';
        puVar4[0xb] = '\r';
        puVar4[0xc] = 'I';
        puVar4[0xd] = 'H';
        puVar4[0xe] = 'D';
        puVar4[0xf] = 'R';
        puVar4[0x10] = (uchar)((uint)x >> 0x18);
        puVar4[0x11] = (uchar)((uint)x >> 0x10);
        puVar4[0x12] = (uchar)((uint)x >> 8);
        puVar4[0x13] = (uchar)x;
        puVar4[0x14] = (uchar)((uint)y >> 0x18);
        puVar4[0x15] = (uchar)((uint)y >> 0x10);
        puVar4[0x16] = (uchar)((uint)y >> 8);
        puVar4[0x17] = (uchar)y;
        puVar4[0x18] = '\b';
        puVar4[0x19] = (&DAT_0018f2a0)[lVar14 * 4];
        puVar4[0x1a] = '\0';
        puVar4[0x1b] = '\0';
        local_38 = puVar4 + 0x1d;
        puVar4[0x1c] = '\0';
        stbiw__wpcrc(&local_38,0xd);
        puVar2 = local_38;
        *local_38 = (uchar)((uint)zlen >> 0x18);
        local_38[1] = (uchar)((uint)zlen >> 0x10);
        local_38[2] = (uchar)((uint)zlen >> 8);
        local_38[3] = (uchar)zlen;
        local_38[4] = 'I';
        local_38[5] = 'D';
        local_38[6] = 'A';
        local_38[7] = 'T';
        memmove(local_38 + 8,puVar15,sVar13);
        local_38 = puVar2 + sVar13 + 8;
        free(puVar15);
        stbiw__wpcrc(&local_38,zlen);
        local_38[0] = '\0';
        local_38[1] = '\0';
        local_38[2] = '\0';
        local_38[3] = '\0';
        local_38[4] = 'I';
        local_38[5] = 'E';
        local_38[6] = 'N';
        local_38[7] = 'D';
        local_38 = local_38 + 8;
        stbiw__wpcrc(&local_38,0);
        if (local_38 == puVar4 + *out_len) {
          return puVar4;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/stb/stb_image_write.h"
                      ,0x3e9,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = (j != 0) ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) { // @TODO: clarity: rewrite this to go 0..5, and 'continue' the unwanted ones during 2nd pass
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}